

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quaternion.h
# Opt level: O2

quaternion * __thiscall irr::core::quaternion::operator=(quaternion *this,matrix4 *m)

{
  quaternion *pqVar1;
  f32 fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar3 = m->M[0];
  fVar5 = m->M[5];
  fVar4 = m->M[10];
  fVar6 = fVar3 + fVar5 + fVar4 + 1.0;
  if (fVar6 <= 0.0) {
    if ((fVar3 <= fVar5) || (fVar3 <= fVar4)) {
      if (fVar5 <= fVar4) {
        fVar5 = ((fVar4 + 1.0) - fVar3) - fVar5;
        if (fVar5 < 0.0) {
          fVar5 = sqrtf(fVar5);
        }
        else {
          fVar5 = SQRT(fVar5);
        }
        fVar4 = fVar5 + fVar5;
        this->X = (f32)((m->M[8] + m->M[2]) / fVar4);
        this->Y = (f32)((m->M[9] + m->M[6]) / fVar4);
        this->Z = (f32)(fVar4 * 0.25);
        fVar3 = m->M[1] - m->M[4];
      }
      else {
        fVar4 = ((fVar5 + 1.0) - fVar3) - fVar4;
        if (fVar4 < 0.0) {
          fVar4 = sqrtf(fVar4);
        }
        else {
          fVar4 = SQRT(fVar4);
        }
        fVar4 = fVar4 + fVar4;
        this->X = (f32)((m->M[4] + m->M[1]) / fVar4);
        this->Y = (f32)(fVar4 * 0.25);
        this->Z = (f32)((m->M[9] + m->M[6]) / fVar4);
        fVar3 = m->M[8] - m->M[2];
      }
    }
    else {
      fVar4 = ((fVar3 + 1.0) - fVar5) - fVar4;
      if (fVar4 < 0.0) {
        fVar4 = sqrtf(fVar4);
      }
      else {
        fVar4 = SQRT(fVar4);
      }
      fVar4 = fVar4 + fVar4;
      this->X = (f32)(fVar4 * 0.25);
      this->Y = (f32)((m->M[4] + m->M[1]) / fVar4);
      this->Z = (f32)((m->M[2] + m->M[8]) / fVar4);
      fVar3 = m->M[6] - m->M[9];
    }
    fVar2 = (f32)(fVar3 / fVar4);
  }
  else {
    if (fVar6 < 0.0) {
      fVar6 = sqrtf(fVar6);
    }
    else {
      fVar6 = SQRT(fVar6);
    }
    fVar6 = fVar6 + fVar6;
    this->X = (f32)((m->M[6] - m->M[9]) / fVar6);
    this->Y = (f32)((m->M[8] - m->M[2]) / fVar6);
    this->Z = (f32)((m->M[1] - m->M[4]) / fVar6);
    fVar2 = (f32)(fVar6 * 0.25);
  }
  this->W = fVar2;
  pqVar1 = normalize(this);
  return pqVar1;
}

Assistant:

inline quaternion &quaternion::operator=(const matrix4 &m)
{
	const f32 diag = m[0] + m[5] + m[10] + 1;

	if (diag > 0.0f) {
		const f32 scale = sqrtf(diag) * 2.0f; // get scale from diagonal

		// TODO: speed this up
		X = (m[6] - m[9]) / scale;
		Y = (m[8] - m[2]) / scale;
		Z = (m[1] - m[4]) / scale;
		W = 0.25f * scale;
	} else {
		if (m[0] > m[5] && m[0] > m[10]) {
			// 1st element of diag is greatest value
			// find scale according to 1st element, and double it
			const f32 scale = sqrtf(1.0f + m[0] - m[5] - m[10]) * 2.0f;

			// TODO: speed this up
			X = 0.25f * scale;
			Y = (m[4] + m[1]) / scale;
			Z = (m[2] + m[8]) / scale;
			W = (m[6] - m[9]) / scale;
		} else if (m[5] > m[10]) {
			// 2nd element of diag is greatest value
			// find scale according to 2nd element, and double it
			const f32 scale = sqrtf(1.0f + m[5] - m[0] - m[10]) * 2.0f;

			// TODO: speed this up
			X = (m[4] + m[1]) / scale;
			Y = 0.25f * scale;
			Z = (m[9] + m[6]) / scale;
			W = (m[8] - m[2]) / scale;
		} else {
			// 3rd element of diag is greatest value
			// find scale according to 3rd element, and double it
			const f32 scale = sqrtf(1.0f + m[10] - m[0] - m[5]) * 2.0f;

			// TODO: speed this up
			X = (m[8] + m[2]) / scale;
			Y = (m[9] + m[6]) / scale;
			Z = 0.25f * scale;
			W = (m[1] - m[4]) / scale;
		}
	}

	return normalize();
}